

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardCommon.cpp
# Opt level: O3

void leopard::xor_mem_2to1(void *x,void *y,void *z,uint64_t bytes)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [32];
  undefined1 (*pauVar5) [32];
  undefined1 (*pauVar6) [32];
  uint64_t uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  
  if (CpuHasAVX2 == '\0') {
    uVar7 = 0;
    do {
      auVar8 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)z + uVar7),
                                   *(undefined1 (*) [16])((long)y + uVar7),
                                   *(undefined1 (*) [16])((long)x + uVar7),0x96);
      auVar9 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)z + uVar7 + 0x10),
                                   *(undefined1 (*) [16])((long)y + uVar7 + 0x10),
                                   *(undefined1 (*) [16])((long)x + uVar7 + 0x10),0x96);
      auVar10 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)z + uVar7 + 0x20),
                                    *(undefined1 (*) [16])((long)y + uVar7 + 0x20),
                                    *(undefined1 (*) [16])((long)x + uVar7 + 0x20),0x96);
      auVar11 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)z + uVar7 + 0x30),
                                    *(undefined1 (*) [16])((long)y + uVar7 + 0x30),
                                    *(undefined1 (*) [16])((long)x + uVar7 + 0x30),0x96);
      *(undefined1 (*) [16])((long)x + uVar7) = auVar8;
      *(undefined1 (*) [16])((long)x + uVar7 + 0x10) = auVar9;
      *(undefined1 (*) [16])((long)x + uVar7 + 0x20) = auVar10;
      *(undefined1 (*) [16])((long)x + uVar7 + 0x30) = auVar11;
      uVar7 = uVar7 + 0x40;
    } while (bytes != uVar7);
  }
  else {
    if (0x7f < bytes) {
      do {
        auVar12 = *y;
        pauVar1 = (undefined1 (*) [32])((long)y + 0x20);
        pauVar2 = (undefined1 (*) [32])((long)y + 0x40);
        pauVar3 = (undefined1 (*) [32])((long)y + 0x60);
        auVar13 = *z;
        pauVar4 = (undefined1 (*) [32])((long)z + 0x20);
        pauVar5 = (undefined1 (*) [32])((long)z + 0x40);
        pauVar6 = (undefined1 (*) [32])((long)z + 0x60);
        y = (void *)((long)y + 0x80);
        z = (void *)((long)z + 0x80);
        bytes = bytes - 0x80;
        auVar12 = vpternlogq_avx512vl(auVar13,auVar12,*x,0x96);
        auVar13 = vpternlogq_avx512vl(*pauVar4,*pauVar1,*(undefined1 (*) [32])((long)x + 0x20),0x96)
        ;
        auVar14 = vpternlogq_avx512vl(*pauVar5,*pauVar2,*(undefined1 (*) [32])((long)x + 0x40),0x96)
        ;
        auVar15 = vpternlogq_avx512vl(*pauVar6,*pauVar3,*(undefined1 (*) [32])((long)x + 0x60),0x96)
        ;
        *(undefined1 (*) [32])x = auVar12;
        *(undefined1 (*) [32])((long)x + 0x20) = auVar13;
        *(undefined1 (*) [32])((long)x + 0x40) = auVar14;
        *(undefined1 (*) [32])((long)x + 0x60) = auVar15;
        x = (void *)((long)x + 0x80);
      } while (0x7f < bytes);
    }
    if (bytes != 0) {
      auVar12 = vpternlogq_avx512vl(*z,*y,*x,0x96);
      auVar13 = vpternlogq_avx512vl(*(undefined1 (*) [32])((long)z + 0x20),
                                    *(undefined1 (*) [32])((long)y + 0x20),
                                    *(undefined1 (*) [32])((long)x + 0x20),0x96);
      *(undefined1 (*) [32])x = auVar12;
      *(undefined1 (*) [32])((long)x + 0x20) = auVar13;
      return;
    }
  }
  return;
}

Assistant:

void xor_mem_2to1(
    void * LEO_RESTRICT x,
    const void * LEO_RESTRICT y,
    const void * LEO_RESTRICT z,
    uint64_t bytes)
{
#if defined(LEO_TRY_AVX2)
    if (CpuHasAVX2)
    {
        LEO_M256 * LEO_RESTRICT x32 = reinterpret_cast<LEO_M256 *>(x);
        const LEO_M256 * LEO_RESTRICT y32 = reinterpret_cast<const LEO_M256 *>(y);
        const LEO_M256 * LEO_RESTRICT z32 = reinterpret_cast<const LEO_M256 *>(z);
        while (bytes >= 128)
        {
            LEO_M256 x0 = _mm256_xor_si256(_mm256_loadu_si256(x32), _mm256_loadu_si256(y32));
            x0 = _mm256_xor_si256(x0, _mm256_loadu_si256(z32));
            LEO_M256 x1 = _mm256_xor_si256(_mm256_loadu_si256(x32 + 1), _mm256_loadu_si256(y32 + 1));
            x1 = _mm256_xor_si256(x1, _mm256_loadu_si256(z32 + 1));
            LEO_M256 x2 = _mm256_xor_si256(_mm256_loadu_si256(x32 + 2), _mm256_loadu_si256(y32 + 2));
            x2 = _mm256_xor_si256(x2, _mm256_loadu_si256(z32 + 2));
            LEO_M256 x3 = _mm256_xor_si256(_mm256_loadu_si256(x32 + 3), _mm256_loadu_si256(y32 + 3));
            x3 = _mm256_xor_si256(x3, _mm256_loadu_si256(z32 + 3));
            _mm256_storeu_si256(x32, x0);
            _mm256_storeu_si256(x32 + 1, x1);
            _mm256_storeu_si256(x32 + 2, x2);
            _mm256_storeu_si256(x32 + 3, x3);
            x32 += 4, y32 += 4, z32 += 4;
            bytes -= 128;
        };

        if (bytes > 0)
        {
            LEO_M256 x0 = _mm256_xor_si256(_mm256_loadu_si256(x32),     _mm256_loadu_si256(y32));
            x0 = _mm256_xor_si256(x0, _mm256_loadu_si256(z32));
            LEO_M256 x1 = _mm256_xor_si256(_mm256_loadu_si256(x32 + 1), _mm256_loadu_si256(y32 + 1));
            x1 = _mm256_xor_si256(x1, _mm256_loadu_si256(z32 + 1));
            _mm256_storeu_si256(x32, x0);
            _mm256_storeu_si256(x32 + 1, x1);
        }

        return;
    }
#endif // LEO_TRY_AVX2

    LEO_M128 * LEO_RESTRICT x16 = reinterpret_cast<LEO_M128 *>(x);
    const LEO_M128 * LEO_RESTRICT y16 = reinterpret_cast<const LEO_M128 *>(y);
    const LEO_M128 * LEO_RESTRICT z16 = reinterpret_cast<const LEO_M128 *>(z);
    do
    {
        LEO_M128 x0 = _mm_xor_si128(_mm_loadu_si128(x16), _mm_loadu_si128(y16));
        x0 = _mm_xor_si128(x0, _mm_loadu_si128(z16));
        LEO_M128 x1 = _mm_xor_si128(_mm_loadu_si128(x16 + 1), _mm_loadu_si128(y16 + 1));
        x1 = _mm_xor_si128(x1, _mm_loadu_si128(z16 + 1));
        LEO_M128 x2 = _mm_xor_si128(_mm_loadu_si128(x16 + 2), _mm_loadu_si128(y16 + 2));
        x2 = _mm_xor_si128(x2, _mm_loadu_si128(z16 + 2));
        LEO_M128 x3 = _mm_xor_si128(_mm_loadu_si128(x16 + 3), _mm_loadu_si128(y16 + 3));
        x3 = _mm_xor_si128(x3, _mm_loadu_si128(z16 + 3));
        _mm_storeu_si128(x16, x0);
        _mm_storeu_si128(x16 + 1, x1);
        _mm_storeu_si128(x16 + 2, x2);
        _mm_storeu_si128(x16 + 3, x3);
        x16 += 4, y16 += 4, z16 += 4;
        bytes -= 64;
    } while (bytes > 0);
}